

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

int64_t __thiscall node::anon_unknown_2::NodeImpl::getLastBlockTime(NodeImpl *this)

{
  uint uVar1;
  pointer ppCVar2;
  ChainstateManager *pCVar3;
  Chainstate *pCVar4;
  Options *pOVar5;
  long lVar6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  unique_lock<std::recursive_mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_20,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
             ,0x13c,false);
  pCVar3 = chainman(this);
  pCVar4 = ChainstateManager::ActiveChainstate(pCVar3);
  ppCVar2 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((ppCVar2 ==
       (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) || (ppCVar2[-1] == (CBlockIndex *)0x0)) {
    pCVar3 = chainman(this);
    pOVar5 = &pCVar3->m_options;
    lVar6 = 0x28c;
  }
  else {
    pCVar3 = chainman(this);
    pCVar4 = ChainstateManager::ActiveChainstate(pCVar3);
    pOVar5 = (Options *)
             ((pCVar4->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -1);
    lVar6 = 0x80;
  }
  uVar1 = *(uint *)((long)(pOVar5->chainparams->consensus).hashGenesisBlock.super_base_blob<256U>.
                          m_data._M_elems + lVar6);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (ulong)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

int64_t getLastBlockTime() override
    {
        LOCK(::cs_main);
        if (chainman().ActiveChain().Tip()) {
            return chainman().ActiveChain().Tip()->GetBlockTime();
        }
        return chainman().GetParams().GenesisBlock().GetBlockTime(); // Genesis block's time of current network
    }